

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::broadcastToFederates(CommonCore *this,ActionMessage *cmd)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  FedInfo **ppFVar4;
  FedInfo *pFVar5;
  FedInfo **ppFVar6;
  FedInfo **ppFVar7;
  int iVar8;
  ulong uVar9;
  
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar9 = (ulong)(this->loopFederates).dataStorage.bsize;
    ppFVar7 = (this->loopFederates).dataStorage.dataptr;
    if (uVar9 != 0x20) {
      ppFVar7 = ppFVar7 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar5 = *ppFVar7 + uVar9;
      goto LAB_002b1e6f;
    }
    if (ppFVar7 == (FedInfo **)0x0) {
      ppFVar7 = &gmlc::containers::
                 StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                 emptyValue;
    }
    else {
      ppFVar7 = ppFVar7 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
    }
  }
  else {
    ppFVar7 = (this->loopFederates).dataStorage.dataptr;
  }
  pFVar5 = *ppFVar7;
  uVar9 = 0;
LAB_002b1e6f:
  iVar8 = (this->loopFederates).dataStorage.bsize;
  ppFVar6 = (this->loopFederates).dataStorage.dataptr;
  lVar2 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar6 == (FedInfo **)0x0) {
    ppFVar4 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar4 = ppFVar6 + lVar2 + 1;
  }
  iVar3 = 0;
  if (iVar8 != 0x20) {
    iVar3 = iVar8;
  }
  ppFVar6 = ppFVar6 + lVar2;
  if (iVar8 == 0x20) {
    ppFVar6 = ppFVar4;
  }
  while ((iVar8 = (int)uVar9, iVar8 != iVar3 || (ppFVar7 != ppFVar6))) {
    if ((pFVar5->fed != (FederateState *)0x0) && (pFVar5->state == OPERATING)) {
      (cmd->dest_id).gid = (pFVar5->fed->global_id)._M_i.gid;
      FederateState::addAction(pFVar5->fed,cmd);
    }
    uVar1 = iVar8 + 1;
    if (iVar8 < 0x1f) {
      pFVar5 = pFVar5 + 1;
    }
    else {
      ppFVar7 = ppFVar7 + (ulong)(iVar8 - 0x1fU >> 5) + 1;
      uVar1 = uVar1 & 0x1f;
      pFVar5 = (FedInfo *)((long)&(*ppFVar7)->fed + (ulong)(uVar1 << 4));
    }
    uVar9 = (ulong)uVar1;
  }
  return;
}

Assistant:

void CommonCore::broadcastToFederates(ActionMessage& cmd)
{
    loopFederates.apply([&cmd](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            cmd.dest_id = fed->global_id;
            fed->addAction(cmd);
        }
    });
}